

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CursorImpl.cpp
# Opt level: O3

bool __thiscall
sf::priv::CursorImpl::loadFromPixels(CursorImpl *this,Uint8 *pixels,Vector2u size,Vector2u hotspot)

{
  byte *pbVar1;
  Display *pDVar2;
  void *pvVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Cursor CVar7;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Uint8 *pUVar14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mask;
  XColor fg;
  XColor bg;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  Vector2u local_58;
  allocator_type local_50 [8];
  undefined4 local_48;
  undefined2 local_44;
  allocator_type local_40 [8];
  undefined4 local_38;
  undefined2 local_34;
  
  uVar13 = (ulong)size >> 0x20;
  local_58 = hotspot;
  if (this->m_cursor != 0) {
    XFreeCursor(this->m_display);
    this->m_cursor = 0;
  }
  uVar4 = (ulong)((size.x + 7 >> 3) * size.y);
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_70,uVar4,(value_type_conflict3 *)&local_88,local_50);
  local_50[0] = (allocator_type)0x1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_88,uVar4,(value_type_conflict3 *)local_50,local_40);
  if (uVar13 != 0) {
    uVar4 = (ulong)size & 0xffffffff;
    pUVar14 = pixels + 3;
    lVar9 = 0;
    uVar10 = 0;
    do {
      if (uVar4 != 0) {
        uVar11 = 0;
        do {
          uVar12 = lVar9 + uVar11 >> 3;
          bVar8 = (byte)uVar11 & 7;
          local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12] =
               local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12] | (pUVar14[uVar11 * 4] != '\0') << bVar8;
          pbVar1 = (byte *)(CONCAT71(local_88.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_88.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + uVar12);
          *pbVar1 = *pbVar1 | (0x40 < (uint)pUVar14[uVar11 * 4 + -1] +
                                      (uint)pUVar14[uVar11 * 4 + -2] +
                                      (uint)pUVar14[uVar11 * 4 + -3]) << bVar8;
          uVar11 = uVar11 + 1;
        } while (uVar4 != uVar11);
      }
      uVar10 = uVar10 + 1;
      pUVar14 = pUVar14 + uVar4 * 4;
      lVar9 = lVar9 + uVar4;
    } while (uVar10 != uVar13);
  }
  pDVar2 = this->m_display;
  uVar5 = XDefaultRootWindow(pDVar2);
  uVar5 = XCreateBitmapFromData
                    (pDVar2,uVar5,
                     local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,(ulong)size & 0xffffffff,uVar13);
  pDVar2 = this->m_display;
  uVar6 = XDefaultRootWindow(pDVar2);
  uVar6 = XCreateBitmapFromData
                    (pDVar2,uVar6,
                     CONCAT71(local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._1_7_,
                              local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_1_),
                     (ulong)size & 0xffffffff,uVar13);
  local_44 = 0xffff;
  local_48 = 0xffffffff;
  local_34 = 0;
  local_38 = 0;
  CVar7 = XCreatePixmapCursor(this->m_display,uVar6,uVar5);
  this->m_cursor = CVar7;
  XFreePixmap(this->m_display,uVar6);
  XFreePixmap(this->m_display,uVar5);
  pvVar3 = (void *)CONCAT71(local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._1_7_,
                            local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._0_1_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool CursorImpl::loadFromPixels(const Uint8* pixels, Vector2u size, Vector2u hotspot)
{
    release();

    // Convert the image into a bitmap (monochrome!).
    std::size_t bytes = (size.x + 7) / 8 * size.y;
    std::vector<Uint8> mask(bytes, 0); // Defines which pixel is transparent.
    std::vector<Uint8> data(bytes, 1); // Defines which pixel is white/black.

    for (std::size_t j = 0; j < size.y; ++j)
    {
        for (std::size_t i = 0; i < size.x; ++i)
        {
            std::size_t pixelIndex = i + j * size.x;
            std::size_t byteIndex  = pixelIndex / 8;
            std::size_t bitIndex   = i % 8;

            // Turn on pixel that are not transparent
            Uint8 opacity = pixels[pixelIndex * 4 + 3] > 0 ? 1 : 0;
            mask[byteIndex] |= opacity << bitIndex;

            // Choose between black/background & white/foreground color for each pixel,
            // based on the pixel color intensity: on average, if a channel is "active"
            // at 25%, the bit is white.
            int intensity = pixels[pixelIndex * 4 + 0] + pixels[pixelIndex * 4 + 1] + pixels[pixelIndex * 4 + 2];
            Uint8 bit = intensity > 64 ? 1 : 0;
            data[byteIndex] |= bit << bitIndex;
        }
    }

    Pixmap maskPixmap = XCreateBitmapFromData(m_display, XDefaultRootWindow(m_display),
                                              (char*)&mask[0], size.x, size.y);
    Pixmap dataPixmap = XCreateBitmapFromData(m_display, XDefaultRootWindow(m_display),
                                              (char*)&data[0], size.x, size.y);

    // Define the foreground color as white and the background as black.
    XColor fg, bg;
    fg.red = fg.blue = fg.green = -1;
    bg.red = bg.blue = bg.green =  0;

    // Create the monochrome cursor.
    m_cursor = XCreatePixmapCursor(m_display,
                                   dataPixmap, maskPixmap,
                                   &fg, &bg,
                                   hotspot.x, hotspot.y);

    // Free the resources
    XFreePixmap(m_display, dataPixmap);
    XFreePixmap(m_display, maskPixmap);

    // We assume everything went fine...
    return true;
}